

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O3

void __thiscall
lsim::gui::CircuitEditor::set_simulation_instance
          (CircuitEditor *this,SimCircuit *sim_circuit,bool view_only)

{
  pointer pSVar1;
  
  if (this->m_sim_circuit == (SimCircuit *)0x0 && sim_circuit != (SimCircuit *)0x0) {
    this->m_state = CS_SIMULATING;
    this->m_view_only = view_only;
    pSVar1 = (this->m_selection).
             super__Vector_base<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_selection).
        super__Vector_base<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar1) {
      (this->m_selection).
      super__Vector_base<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
    }
  }
  else if (sim_circuit == (SimCircuit *)0x0 && this->m_sim_circuit != (SimCircuit *)0x0) {
    this->m_state = CS_IDLE;
    this->m_view_only = false;
  }
  this->m_sim_circuit = sim_circuit;
  return;
}

Assistant:

void CircuitEditor::set_simulation_instance(SimCircuit *sim_circuit, bool view_only) {

	if (sim_circuit != nullptr && m_sim_circuit == nullptr) {
		m_state = CS_SIMULATING;
		m_view_only = view_only;
		clear_selection();
	}

	if (sim_circuit == nullptr && m_sim_circuit != nullptr) {
		m_state = CS_IDLE;
		m_view_only = false;
	}

	m_sim_circuit = sim_circuit;
}